

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

int update_demo_menu(DEMO_MENU *menu)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  long in_RDI;
  int i;
  int c;
  int tmp;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_18;
  int local_14;
  int local_4;
  
  update_background();
  update_credits();
  if (selected_item != -1) {
    (**(code **)(in_RDI + (long)selected_item * 0x38))(in_RDI + (long)selected_item * 0x38,3,0);
  }
  local_14 = 0;
  while (*(long *)(in_RDI + (long)local_14 * 0x38) != 0) {
    iVar2 = (**(code **)(in_RDI + (long)local_14 * 0x38))(in_RDI + (long)local_14 * 0x38,6,0);
    if (iVar2 == 0x3ea) {
      locked = 0;
      return 1000;
    }
    local_14 = local_14 + 1;
  }
  if (locked == 1) {
    local_4 = 1000;
  }
  else {
    _Var1 = key_pressed(0x3b);
    if (_Var1) {
      local_4 = 0x3e9;
    }
    else {
      _Var1 = mouse_button_pressed(1);
      if (_Var1) {
        in_stack_ffffffffffffffe4 = 0;
        while (*(long *)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38) != 0) {
          iVar2 = mouse_x();
          if ((((*(int *)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38 + 0x28) <= iVar2) &&
               (iVar2 = mouse_y(),
               *(int *)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38 + 0x2c) <= iVar2)) &&
              (iVar2 = mouse_x(),
              iVar2 < *(int *)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38 + 0x28) +
                      *(int *)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38 + 0x30))) &&
             ((iVar2 = mouse_y(),
              iVar2 < *(int *)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38 + 0x2c) +
                      *(int *)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38 + 0x34) &&
              ((*(uint *)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38 + 0x10) & 1) != 0)))) {
            if (selected_item != -1) {
              lVar3 = in_RDI + (long)selected_item * 0x38;
              *(uint *)(lVar3 + 0x10) = *(uint *)(lVar3 + 0x10) & 0xfffffffd;
            }
            lVar3 = in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38;
            selected_item = in_stack_ffffffffffffffe4;
            *(uint *)(lVar3 + 0x10) = *(uint *)(lVar3 + 0x10) | 2;
            play_sound_id(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
                          in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
            iVar2 = (**(code **)(in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38))
                              (in_RDI + (long)in_stack_ffffffffffffffe4 * 0x38,2,0xd);
            return iVar2;
          }
          in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1;
        }
      }
      _Var1 = key_pressed(0x54);
      iVar2 = selected_item;
      if ((_Var1) && (selected_item != -1)) {
        do {
          selected_item = selected_item + -1;
          if (selected_item < 0) {
            selected_item = item_count + -1;
          }
        } while ((*(uint *)(in_RDI + (long)selected_item * 0x38 + 0x10) & 1) == 0);
        if (iVar2 != selected_item) {
          lVar3 = in_RDI + (long)iVar2 * 0x38;
          *(uint *)(lVar3 + 0x10) = *(uint *)(lVar3 + 0x10) & 0xfffffffd;
          lVar3 = in_RDI + (long)selected_item * 0x38;
          *(uint *)(lVar3 + 0x10) = *(uint *)(lVar3 + 0x10) | 2;
          play_sound_id(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
                        in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
        }
      }
      _Var1 = key_pressed(0x55);
      iVar2 = selected_item;
      if ((_Var1) && (selected_item != -1)) {
        do {
          selected_item = selected_item + 1;
          if (item_count <= selected_item) {
            selected_item = 0;
          }
        } while ((*(uint *)(in_RDI + (long)selected_item * 0x38 + 0x10) & 1) == 0);
        if (iVar2 != selected_item) {
          lVar3 = in_RDI + (long)iVar2 * 0x38;
          *(uint *)(lVar3 + 0x10) = *(uint *)(lVar3 + 0x10) & 0xfffffffd;
          lVar3 = in_RDI + (long)selected_item * 0x38;
          *(uint *)(lVar3 + 0x10) = *(uint *)(lVar3 + 0x10) | 2;
          play_sound_id(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
                        in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
        }
      }
      local_18 = unicode_char(true);
      _Var1 = gamepad_button();
      if (_Var1) {
        local_18 = 0x20;
      }
      if ((selected_item == -1) || (local_18 == 0)) {
        local_4 = 1000;
      }
      else {
        local_4 = (**(code **)(in_RDI + (long)selected_item * 0x38))
                            (in_RDI + (long)selected_item * 0x38,2,local_18);
        if (local_4 == 0x3ea) {
          locked = 1;
          local_4 = 1000;
        }
        else {
          locked = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int update_demo_menu(DEMO_MENU * menu)
{
   int tmp, c;

   update_background();
   update_credits();
   
   if (selected_item != -1) {
      menu[selected_item].proc(&menu[selected_item], DEMO_MENU_MSG_KEY, 0);
   }

   for (tmp = 0; menu[tmp].proc != 0; tmp++) {
      if (menu[tmp].proc(&menu[tmp], DEMO_MENU_MSG_TICK, 0) == DEMO_MENU_LOCK) {
         locked = 0;
         return DEMO_MENU_CONTINUE;
      }
   }

   if (locked == 1) {
      return DEMO_MENU_CONTINUE;
   }

   if (key_pressed(ALLEGRO_KEY_ESCAPE)) {
      return DEMO_MENU_BACK;
   }
   
   /* If a mouse button is pressed, select the item under it and send a
    * DEMO_MENU_MSG_CHAR with 13 to it (which is the same effect as hitting
    * the return key).
    */
   if (mouse_button_pressed(1)) {
      int i;
      for (i = 0; menu[i].proc != NULL; i++) {
         if (mouse_x() >= menu[i].x && mouse_y() >= menu[i].y &&
               mouse_x() < menu[i].x + menu[i].w &&
               mouse_y() < menu[i].y + menu[i].h) {
            if (menu[i].flags & DEMO_MENU_SELECTABLE) {
               if (selected_item != -1) {
                  menu[selected_item].flags &= ~DEMO_MENU_SELECTED;
               }
               selected_item = i;
               menu[i].flags |= DEMO_MENU_SELECTED;
               play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
               return menu[i].proc(&menu[i], DEMO_MENU_MSG_CHAR, 13);
            }
         }
      }
   }

   if (key_pressed(ALLEGRO_KEY_UP)) {
      if (selected_item != -1) {
         tmp = selected_item;

         while (1) {
            --selected_item;
            if (selected_item < 0) {
               selected_item = item_count - 1;
            }

            if (menu[selected_item].flags & DEMO_MENU_SELECTABLE) {
               break;
            }
         }

         if (tmp != selected_item) {
            menu[tmp].flags &= ~DEMO_MENU_SELECTED;
            menu[selected_item].flags |= DEMO_MENU_SELECTED;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation,
                       0);
         }
      }
   }
    
   if (key_pressed(ALLEGRO_KEY_DOWN)) {
      if (selected_item != -1) {
         tmp = selected_item;

         while (1) {
            ++selected_item;
            if (selected_item >= item_count) {
               selected_item = 0;
            }

            if (menu[selected_item].flags & DEMO_MENU_SELECTABLE) {
               break;
            }
         }

         if (tmp != selected_item) {
            menu[tmp].flags &= ~DEMO_MENU_SELECTED;
            menu[selected_item].flags |= DEMO_MENU_SELECTED;
            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation,
                       0);
         }
      }
   }
    
    c = unicode_char(true);
    if(gamepad_button()) {
        c = 32;
    }

   if (selected_item != -1 && c) {
      tmp = menu[selected_item].proc(&menu[selected_item],
         DEMO_MENU_MSG_CHAR, c);
      if (tmp == DEMO_MENU_LOCK) {
         locked = 1;
         return DEMO_MENU_CONTINUE;
      } else {
         locked = 0;
         return tmp;
      }
   }

   return DEMO_MENU_CONTINUE;
}